

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ibverbs_communicator.cpp
# Opt level: O0

void __thiscall IBVerbsCommunicator::~IBVerbsCommunicator(IBVerbsCommunicator *this)

{
  size_type sVar1;
  reference pvVar2;
  reference pvVar3;
  vector<ProcessQueue,_std::allocator<ProcessQueue>_> *in_RDI;
  size_t i_1;
  size_t i;
  ulong local_18;
  ulong local_10;
  
  local_10 = 0;
  while( true ) {
    sVar1 = std::vector<ProcessQueue,_std::allocator<ProcessQueue>_>::size
                      ((vector<ProcessQueue,_std::allocator<ProcessQueue>_> *)
                       &in_RDI[2].super__Vector_base<ProcessQueue,_std::allocator<ProcessQueue>_>.
                        _M_impl.super__Vector_impl_data._M_finish);
    if (sVar1 <= local_10) break;
    pvVar2 = std::vector<ProcessQueue,_std::allocator<ProcessQueue>_>::operator[]
                       ((vector<ProcessQueue,_std::allocator<ProcessQueue>_> *)
                        &in_RDI[2].super__Vector_base<ProcessQueue,_std::allocator<ProcessQueue>_>.
                         _M_impl.super__Vector_impl_data._M_finish,local_10);
    if (pvVar2->queue_pair != (ibv_qp *)0x0) {
      pvVar2 = std::vector<ProcessQueue,_std::allocator<ProcessQueue>_>::operator[]
                         ((vector<ProcessQueue,_std::allocator<ProcessQueue>_> *)
                          &in_RDI[2].super__Vector_base<ProcessQueue,_std::allocator<ProcessQueue>_>
                           ._M_impl.super__Vector_impl_data._M_finish,local_10);
      ibv_destroy_qp(pvVar2->queue_pair);
    }
    pvVar2 = std::vector<ProcessQueue,_std::allocator<ProcessQueue>_>::operator[]
                       ((vector<ProcessQueue,_std::allocator<ProcessQueue>_> *)
                        &in_RDI[2].super__Vector_base<ProcessQueue,_std::allocator<ProcessQueue>_>.
                         _M_impl.super__Vector_impl_data._M_finish,local_10);
    if (pvVar2->recv_complete_queue != (ibv_cq *)0x0) {
      pvVar2 = std::vector<ProcessQueue,_std::allocator<ProcessQueue>_>::operator[]
                         ((vector<ProcessQueue,_std::allocator<ProcessQueue>_> *)
                          &in_RDI[2].super__Vector_base<ProcessQueue,_std::allocator<ProcessQueue>_>
                           ._M_impl.super__Vector_impl_data._M_finish,local_10);
      ibv_destroy_cq(pvVar2->recv_complete_queue);
    }
    pvVar2 = std::vector<ProcessQueue,_std::allocator<ProcessQueue>_>::operator[]
                       ((vector<ProcessQueue,_std::allocator<ProcessQueue>_> *)
                        &in_RDI[2].super__Vector_base<ProcessQueue,_std::allocator<ProcessQueue>_>.
                         _M_impl.super__Vector_impl_data._M_finish,local_10);
    if (pvVar2->send_complete_queue != (ibv_cq *)0x0) {
      pvVar2 = std::vector<ProcessQueue,_std::allocator<ProcessQueue>_>::operator[]
                         ((vector<ProcessQueue,_std::allocator<ProcessQueue>_> *)
                          &in_RDI[2].super__Vector_base<ProcessQueue,_std::allocator<ProcessQueue>_>
                           ._M_impl.super__Vector_impl_data._M_finish,local_10);
      ibv_destroy_cq(pvVar2->send_complete_queue);
    }
    local_10 = local_10 + 1;
  }
  local_18 = 0;
  while( true ) {
    sVar1 = std::
            vector<std::pair<ibv_mr_*,_ibv_mr_*>,_std::allocator<std::pair<ibv_mr_*,_ibv_mr_*>_>_>::
            size((vector<std::pair<ibv_mr_*,_ibv_mr_*>,_std::allocator<std::pair<ibv_mr_*,_ibv_mr_*>_>_>
                  *)&in_RDI[4].super__Vector_base<ProcessQueue,_std::allocator<ProcessQueue>_>.
                     _M_impl.super__Vector_impl_data._M_finish);
    if (sVar1 <= local_18) break;
    pvVar3 = std::
             vector<std::pair<ibv_mr_*,_ibv_mr_*>,_std::allocator<std::pair<ibv_mr_*,_ibv_mr_*>_>_>
             ::operator[]((vector<std::pair<ibv_mr_*,_ibv_mr_*>,_std::allocator<std::pair<ibv_mr_*,_ibv_mr_*>_>_>
                           *)&in_RDI[4].
                              super__Vector_base<ProcessQueue,_std::allocator<ProcessQueue>_>.
                              _M_impl.super__Vector_impl_data._M_finish,local_18);
    if (pvVar3->first != (ibv_mr *)0x0) {
      pvVar3 = std::
               vector<std::pair<ibv_mr_*,_ibv_mr_*>,_std::allocator<std::pair<ibv_mr_*,_ibv_mr_*>_>_>
               ::operator[]((vector<std::pair<ibv_mr_*,_ibv_mr_*>,_std::allocator<std::pair<ibv_mr_*,_ibv_mr_*>_>_>
                             *)&in_RDI[4].
                                super__Vector_base<ProcessQueue,_std::allocator<ProcessQueue>_>.
                                _M_impl.super__Vector_impl_data._M_finish,local_18);
      ibv_dereg_mr(pvVar3->first);
      pvVar3 = std::
               vector<std::pair<ibv_mr_*,_ibv_mr_*>,_std::allocator<std::pair<ibv_mr_*,_ibv_mr_*>_>_>
               ::operator[]((vector<std::pair<ibv_mr_*,_ibv_mr_*>,_std::allocator<std::pair<ibv_mr_*,_ibv_mr_*>_>_>
                             *)&in_RDI[4].
                                super__Vector_base<ProcessQueue,_std::allocator<ProcessQueue>_>.
                                _M_impl.super__Vector_impl_data._M_finish,local_18);
      pvVar3->first = (ibv_mr *)0x0;
    }
    pvVar3 = std::
             vector<std::pair<ibv_mr_*,_ibv_mr_*>,_std::allocator<std::pair<ibv_mr_*,_ibv_mr_*>_>_>
             ::operator[]((vector<std::pair<ibv_mr_*,_ibv_mr_*>,_std::allocator<std::pair<ibv_mr_*,_ibv_mr_*>_>_>
                           *)&in_RDI[4].
                              super__Vector_base<ProcessQueue,_std::allocator<ProcessQueue>_>.
                              _M_impl.super__Vector_impl_data._M_finish,local_18);
    if (pvVar3->second != (ibv_mr *)0x0) {
      pvVar3 = std::
               vector<std::pair<ibv_mr_*,_ibv_mr_*>,_std::allocator<std::pair<ibv_mr_*,_ibv_mr_*>_>_>
               ::operator[]((vector<std::pair<ibv_mr_*,_ibv_mr_*>,_std::allocator<std::pair<ibv_mr_*,_ibv_mr_*>_>_>
                             *)&in_RDI[4].
                                super__Vector_base<ProcessQueue,_std::allocator<ProcessQueue>_>.
                                _M_impl.super__Vector_impl_data._M_finish,local_18);
      ibv_dereg_mr(pvVar3->second);
      pvVar3 = std::
               vector<std::pair<ibv_mr_*,_ibv_mr_*>,_std::allocator<std::pair<ibv_mr_*,_ibv_mr_*>_>_>
               ::operator[]((vector<std::pair<ibv_mr_*,_ibv_mr_*>,_std::allocator<std::pair<ibv_mr_*,_ibv_mr_*>_>_>
                             *)&in_RDI[4].
                                super__Vector_base<ProcessQueue,_std::allocator<ProcessQueue>_>.
                                _M_impl.super__Vector_impl_data._M_finish,local_18);
      pvVar3->second = (ibv_mr *)0x0;
    }
    local_18 = local_18 + 1;
  }
  if (in_RDI[6].super__Vector_base<ProcessQueue,_std::allocator<ProcessQueue>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    ibv_dealloc_pd(in_RDI[6].super__Vector_base<ProcessQueue,_std::allocator<ProcessQueue>_>._M_impl
                   .super__Vector_impl_data._M_start);
  }
  if (in_RDI[5].super__Vector_base<ProcessQueue,_std::allocator<ProcessQueue>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    ibv_close_device(in_RDI[5].super__Vector_base<ProcessQueue,_std::allocator<ProcessQueue>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  if (in_RDI[5].super__Vector_base<ProcessQueue,_std::allocator<ProcessQueue>_>._M_impl.
      super__Vector_impl_data._M_finish != (pointer)0x0) {
    ibv_free_device_list
              (in_RDI[5].super__Vector_base<ProcessQueue,_std::allocator<ProcessQueue>_>._M_impl.
               super__Vector_impl_data._M_finish);
  }
  std::vector<timespec,_std::allocator<timespec>_>::~vector
            ((vector<timespec,_std::allocator<timespec>_> *)in_RDI);
  std::vector<timespec,_std::allocator<timespec>_>::~vector
            ((vector<timespec,_std::allocator<timespec>_> *)in_RDI);
  std::vector<timespec,_std::allocator<timespec>_>::~vector
            ((vector<timespec,_std::allocator<timespec>_> *)in_RDI);
  std::vector<timespec,_std::allocator<timespec>_>::~vector
            ((vector<timespec,_std::allocator<timespec>_> *)in_RDI);
  std::vector<timespec,_std::allocator<timespec>_>::~vector
            ((vector<timespec,_std::allocator<timespec>_> *)in_RDI);
  std::vector<timespec,_std::allocator<timespec>_>::~vector
            ((vector<timespec,_std::allocator<timespec>_> *)in_RDI);
  std::vector<timespec,_std::allocator<timespec>_>::~vector
            ((vector<timespec,_std::allocator<timespec>_> *)in_RDI);
  std::vector<std::pair<ibv_mr_*,_ibv_mr_*>,_std::allocator<std::pair<ibv_mr_*,_ibv_mr_*>_>_>::
  ~vector((vector<std::pair<ibv_mr_*,_ibv_mr_*>,_std::allocator<std::pair<ibv_mr_*,_ibv_mr_*>_>_> *)
          in_RDI);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_RDI);
  std::vector<ProcessQueue,_std::allocator<ProcessQueue>_>::~vector(in_RDI);
  return;
}

Assistant:

IBVerbsCommunicator::~IBVerbsCommunicator() {
  // release queues
  for (size_t i = 0; i < pq_world_.size(); i++) {
    if (pq_world_[i].queue_pair != NULL)
      ibv_destroy_qp(pq_world_[i].queue_pair);

    if (pq_world_[i].recv_complete_queue != NULL)
      ibv_destroy_cq(pq_world_[i].recv_complete_queue);

    if (pq_world_[i].send_complete_queue != NULL)
      ibv_destroy_cq(pq_world_[i].send_complete_queue);
  }

  // release memory region which is nonblocking-io but not freed.
  for (size_t i = 0; i < mr_world_.size(); i++) {
    // send
    if (mr_world_[i].first != NULL) {
      ibv_dereg_mr(mr_world_[i].first);
      mr_world_[i].first = NULL;
    }

    // recv
    if (mr_world_[i].second != NULL) {
      ibv_dereg_mr(mr_world_[i].second);
      mr_world_[i].second = NULL;
    }
  }

#ifdef USE_CUDA
  pool_.reset();
#endif

  if (pd_ != NULL) {
    ibv_dealloc_pd(pd_);
  }

  if (context_ != NULL) {
    ibv_close_device(context_);
  }

  if (dev_list_ != NULL) {
    ibv_free_device_list(dev_list_);
  }

#ifdef USE_TRACE
  DumpTrace();
#endif

#ifdef USE_CUDA
  if (tmp_gpu_buffer_ != NULL) {
    CUDACHECK(cudaFree(tmp_gpu_buffer_));
    tmp_gpu_buffer_ = NULL;
  }
#endif
}